

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

int apply_aug(lys_node_augment *augment,unres_schema *unres)

{
  LYS_NODE LVar1;
  lyext_plugin *plVar2;
  lys_node *plVar3;
  int iVar4;
  lys_node *plVar5;
  lys_node *plVar6;
  lys_module *mod;
  ulong uVar7;
  
  plVar5 = augment->target;
  if ((plVar5 == (lys_node *)0x0) || ((augment->flags & 1) == 0)) {
    __assert_fail("augment->target && (augment->flags & LYS_NOTAPPLIED)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0x110f,"int apply_aug(struct lys_node_augment *, struct unres_schema *)");
  }
  plVar6 = augment->child;
  if (plVar6 != (lys_node *)0x0) {
    do {
      LVar1 = plVar5->nodetype;
      if ((LVar1 & (LYS_OUTPUT|LYS_INPUT|LYS_RPC|LYS_NOTIF)) != LYS_UNKNOWN) break;
      if (LVar1 == LYS_EXT) {
        if (plVar5->padding[1] != '\x01') break;
        plVar5 = (lys_node *)plVar5->dsc;
      }
      else {
        plVar5 = plVar5->parent;
        if (plVar5 == (lys_node *)0x0) break;
      }
      if (plVar5->nodetype == LYS_AUGMENT) {
        plVar5 = plVar5->prev;
      }
    } while (plVar5 != (lys_node *)0x0);
    do {
      iVar4 = inherit_config_flag(plVar6,augment->target->flags & 3,
                                  (uint)((LVar1 & (LYS_OUTPUT|LYS_INPUT|LYS_RPC|LYS_NOTIF)) !=
                                        LYS_UNKNOWN));
      if (iVar4 != 0) {
        return -1;
      }
      plVar6 = plVar6->next;
    } while (plVar6 != (lys_node *)0x0);
    plVar5 = augment->target;
    if (plVar5->ext_size != '\0') {
      uVar7 = 0;
      do {
        if (((plVar5->ext[uVar7] != (lys_ext_instance *)0x0) &&
            (plVar2 = plVar5->ext[uVar7]->def->plugin, plVar2 != (lyext_plugin *)0x0)) &&
           ((plVar2->flags & 1) != 0)) {
          plVar6 = (lys_node *)malloc(1);
          if (plVar6 == (lys_node *)0x0) {
            ly_log(augment->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "apply_aug");
            return -1;
          }
          *(char *)&plVar6->name = (char)uVar7;
          mod = augment->module;
          if (mod == (lys_module *)0x0) {
            mod = (lys_module *)0x0;
          }
          else if ((mod->field_0x40 & 1) != 0) {
            mod = (lys_module *)mod->data;
          }
          iVar4 = unres_schema_add_node(mod,unres,&plVar5->ext,UNRES_EXT_FINALIZE,plVar6);
          if (iVar4 == -1) {
            return -1;
          }
          plVar5 = augment->target;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < plVar5->ext_size);
    }
    plVar6 = plVar5->child;
    if (plVar6 == (lys_node *)0x0) {
      plVar5->child = augment->child;
    }
    else {
      plVar5 = plVar6->prev;
      plVar3 = augment->child;
      plVar5->next = plVar3;
      plVar6->prev = plVar3->prev;
      plVar3->prev = plVar5;
    }
  }
  *(byte *)&augment->flags = (byte)augment->flags & 0xfe;
  return 0;
}

Assistant:

int
apply_aug(struct lys_node_augment *augment, struct unres_schema *unres)
{
    struct lys_node *child, *parent;
    int clear_config;
    unsigned int u;
    uint8_t *v;
    struct lys_ext_instance *ext;

    assert(augment->target && (augment->flags & LYS_NOTAPPLIED));

    if (!augment->child) {
        /* nothing to apply */
        goto success;
    }

    /* inherit config information from actual parent */
    for (parent = augment->target; parent && !(parent->nodetype & (LYS_NOTIF | LYS_INPUT | LYS_OUTPUT | LYS_RPC)); parent = lys_parent(parent));
    clear_config = (parent) ? 1 : 0;
    LY_TREE_FOR(augment->child, child) {
        if (inherit_config_flag(child, augment->target->flags & LYS_CONFIG_MASK, clear_config)) {
            return -1;
        }
    }

    /* inherit extensions if any */
    for (u = 0; u < augment->target->ext_size; u++) {
        ext = augment->target->ext[u]; /* shortcut */
        if (ext && ext->def->plugin && (ext->def->plugin->flags & LYEXT_OPT_INHERIT)) {
            v = malloc(sizeof *v);
            LY_CHECK_ERR_RETURN(!v, LOGMEM(augment->module->ctx), -1);
            *v = u;
            if (unres_schema_add_node(lys_main_module(augment->module), unres, &augment->target->ext,
                    UNRES_EXT_FINALIZE, (struct lys_node *)v) == -1) {
                /* something really bad happend since the extension finalization is not actually
                 * being resolved while adding into unres, so something more serious with the unres
                 * list itself must happened */
                return -1;
            }
        }
    }

    /* reconnect augmenting data into the target - add them to the target child list */
    if (augment->target->child) {
        child = augment->target->child->prev;
        child->next = augment->child;
        augment->target->child->prev = augment->child->prev;
        augment->child->prev = child;
    } else {
        augment->target->child = augment->child;
    }

success:
    /* remove the flag about not applicability */
    augment->flags &= ~LYS_NOTAPPLIED;
    return EXIT_SUCCESS;
}